

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

Type * __thiscall wasm::Type::Iterator::operator*(Iterator *this)

{
  bool bVar1;
  bool bVar2;
  Tuple *this_00;
  BasicType local_1c;
  Iterator *local_18;
  Iterator *this_local;
  
  local_18 = this;
  bVar1 = isTuple((this->super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>).parent
                 );
  if (bVar1) {
    this_00 = getTuple((this->super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>).
                       parent);
    this_local = (Iterator *)
                 std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                           (this_00,(this->
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    ).index);
  }
  else {
    bVar1 = false;
    if ((this->super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>).index == 0) {
      local_1c = none;
      bVar2 = Type::operator!=((this->
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>).
                               parent,&local_1c);
      bVar1 = false;
      if (bVar2) {
        bVar1 = true;
      }
    }
    if (!bVar1) {
      __assert_fail("index == 0 && *parent != Type::none && \"Index out of bounds\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                    ,0x35f,"const Type &wasm::Type::Iterator::operator*() const");
    }
    this_local = (Iterator *)
                 (this->super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>).parent;
  }
  return (Type *)this_local;
}

Assistant:

const Type& Type::Iterator::operator*() const {
  if (parent->isTuple()) {
    return parent->getTuple()[index];
  } else {
    assert(index == 0 && *parent != Type::none && "Index out of bounds");
    return *parent;
  }
}